

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  Message *pMVar1;
  uint32_t *puVar2;
  Type type;
  uint32_t uVar3;
  char *pcVar4;
  int in_EDX;
  FieldDescriptor *field_local;
  ReflectionSchema *this_local;
  
  pMVar1 = this->default_instance_;
  puVar2 = this->offsets_;
  pcVar4 = FieldDescriptor::index(field,(char *)field,in_EDX);
  uVar3 = puVar2[(int)pcVar4];
  type = FieldDescriptor::type(field);
  uVar3 = OffsetValue(uVar3,type);
  return (void *)((long)&(pMVar1->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
}

Assistant:

const void* GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8_t*>(default_instance_) +
           OffsetValue(offsets_[field->index()], field->type());
  }